

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::Ifc2DCompositeCurve::~Ifc2DCompositeCurve(Ifc2DCompositeCurve *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  void *pvVar1;
  
  this[-1].super_IfcCompositeCurve.SelfIntersect.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          (IfcCompositeCurve-in-Assimp::IFC::Schema_2x3::Ifc2DCompositeCurve::construction_vtable +
          0x18);
  *(undefined8 *)&(this->super_IfcCompositeCurve).field_0x58 = 0x812330;
  *(undefined8 *)&this[-1].super_IfcCompositeCurve.field_0x80 = 0x812290;
  *(undefined8 *)&this[-1].field_0x90 = 0x8122b8;
  (this->super_IfcCompositeCurve).super_IfcBoundedCurve.super_IfcCurve.
  super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x8122e0;
  *(undefined8 *)
   &(this->super_IfcCompositeCurve).super_IfcBoundedCurve.super_IfcCurve.
    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x812308;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             &(this->super_IfcCompositeCurve).super_IfcBoundedCurve.super_IfcCurve.field_0x40;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pvVar1 = *(void **)&(this->super_IfcCompositeCurve).super_IfcBoundedCurve.super_IfcCurve.
                      super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                      field_0x20;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&(this->super_IfcCompositeCurve).super_IfcBoundedCurve.
                                     super_IfcCurve.super_IfcGeometricRepresentationItem.field_0x30
                           - (long)pvVar1);
  }
  operator_delete(&this[-1].super_IfcCompositeCurve.SelfIntersect.
                   super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount,0xa0);
  return;
}

Assistant:

Ifc2DCompositeCurve() : Object("Ifc2DCompositeCurve") {}